

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

void __thiscall TiXmlAttribute::SetIntValue(TiXmlAttribute *this,int _value)

{
  char local_58 [8];
  char buf [64];
  int _value_local;
  TiXmlAttribute *this_local;
  
  buf._60_4_ = _value;
  snprintf(local_58,0x40,"%d",(ulong)(uint)_value);
  SetValue(this,local_58);
  return;
}

Assistant:

void TiXmlAttribute::SetIntValue( int _value )
{
	char buf [64];
	#if defined(TIXML_SNPRINTF)		
		TIXML_SNPRINTF(buf, sizeof(buf), "%d", _value);
	#else
		sprintf (buf, "%d", _value);
	#endif
	SetValue (buf);
}